

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_9::DiskHandle::tryCommitReplacement
          (DiskHandle *this,StringPtr toPath,int fromDirFd,StringPtr fromPath,WriteMode mode,
          int *errorReason)

{
  StringPtr fromPath_00;
  StringPtr toPath_00;
  StringPtr path;
  DiskHandle *pDVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  WriteMode mode_00;
  void *pvVar6;
  char *pcVar7;
  StringPtr *pSVar8;
  StringPtr path_00;
  StringPtr path_01;
  Fault local_440;
  Fault f_8;
  undefined1 auStack_430 [4];
  int error_6;
  size_t *local_428;
  stat *local_420;
  int local_414;
  undefined1 local_410 [4];
  int _kjSyscallError_6;
  stat stats_2;
  Fault f_7;
  undefined1 auStack_370 [4];
  int error_5;
  size_t *local_368;
  stat *local_360;
  int local_354;
  undefined1 local_350 [4];
  int _kjSyscallError_5;
  stat stats_1;
  char *local_2b8;
  Fault local_2b0;
  Fault f_6;
  undefined1 auStack_2a0 [4];
  int error_4;
  String *local_298;
  size_t *local_290;
  int local_288;
  int local_284;
  int _kjSyscallError_4;
  int error_3;
  StringPtr *local_278;
  DiskHandle *local_270;
  size_t *local_268;
  int local_260;
  undefined4 local_25c;
  int _kjSyscallError_3;
  Fault f_5;
  SyscallResult local_234;
  undefined1 auStack_230 [4];
  SyscallResult _kjSyscallResult_1;
  Function<int_(kj::StringPtr)> local_220;
  ArrayPtr<const_kj::String> local_210;
  undefined1 local_200 [8];
  String away;
  undefined1 local_1d0 [8];
  Path toPathParsed;
  Fault f_4;
  SyscallResult local_194;
  undefined1 local_190 [4];
  SyscallResult _kjSyscallResult;
  stat stats;
  Fault f_3;
  undefined1 auStack_f0 [4];
  int error_2;
  StringPtr *local_e8;
  DiskHandle *local_e0;
  size_t *local_d8;
  int local_cc;
  DiskHandle *pDStack_c8;
  int _kjSyscallError_2;
  char *local_c0;
  Fault local_b8;
  Fault f_2;
  Fault f_1;
  undefined1 auStack_a0 [4];
  int error_1;
  StringPtr *local_98;
  DiskHandle *local_90;
  size_t *local_88;
  int local_80;
  int _kjSyscallError_1;
  Fault local_70;
  Fault f;
  undefined1 auStack_60 [4];
  int error;
  StringPtr *local_58;
  DiskHandle *local_50;
  size_t *local_48;
  int local_40;
  uint local_3c;
  int _kjSyscallError;
  int fromDirFd_local;
  DiskHandle *this_local;
  StringPtr fromPath_local;
  StringPtr toPath_local;
  
  fromPath_local.content.ptr = (char *)fromPath.content.size_;
  this_local = (DiskHandle *)fromPath.content.ptr;
  fromPath_local.content.size_ = (size_t)toPath.content.ptr;
  local_3c = fromDirFd;
  __kjSyscallError = this;
  bVar3 = has<kj::WriteMode,void>(mode,CREATE);
  if ((bVar3) && (bVar3 = has<kj::WriteMode,void>(mode,MODIFY), bVar3)) {
    _auStack_60 = &local_3c;
    local_58 = (StringPtr *)&this_local;
    local_48 = &fromPath_local.content.size_;
    local_50 = this;
    f.exception._4_4_ =
         kj::_::Debug::
         syscallError<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::_lambda()_1_>
                   ((anon_class_32_4_43b4ee3f *)auStack_60,false);
    if (f.exception._4_4_ == 0) {
      return true;
    }
    local_40 = f.exception._4_4_;
    if (((f.exception._4_4_ != 0x11) && (1 < f.exception._4_4_ - 0x14U)) &&
       (f.exception._4_4_ != 0x27)) {
      if (errorReason == (int *)0x0) {
        kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                  (&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x440,f.exception._4_4_,"rename(fromPath, toPath)","fromPath, toPath",
                   (StringPtr *)&this_local,(StringPtr *)&fromPath_local.content.size_);
        kj::_::Debug::Fault::~Fault(&local_70);
        return false;
      }
      *errorReason = f.exception._4_4_;
      return false;
    }
  }
  bVar3 = has<kj::WriteMode,void>(mode,MODIFY);
  if (bVar3) {
    _auStack_a0 = &local_3c;
    pSVar8 = (StringPtr *)&this_local;
    local_88 = &fromPath_local.content.size_;
    local_98 = pSVar8;
    local_90 = this;
    local_80 = kj::_::Debug::
               syscallError<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::_lambda()_2_>
                         ((anon_class_32_4_43b4ee3f *)auStack_a0,false);
    if (local_80 == 0) {
      pDStack_c8 = this_local;
      local_c0 = fromPath_local.content.ptr;
      path_00.content.size_ = (size_t)pSVar8;
      path_00.content.ptr = fromPath_local.content.ptr;
      rmrf((anon_unknown_9 *)(ulong)local_3c,(int)this_local,path_00);
      return true;
    }
    if (local_80 == 2) {
      bVar3 = has<kj::WriteMode,void>(mode,CREATE);
      if (!bVar3) {
        return false;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,char_const(&)[122],kj::StringPtr&,kj::StringPtr&>
                (&f_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x460,FAILED,(char *)0x0,
                 "\"rename(tmp, path) claimed path exists but \" \"renameat2(fromPath, toPath, EXCHANGE) said it doesn\'t; concurrent modification?\", fromPath, toPath"
                 ,(char (*) [122])
                  "rename(tmp, path) claimed path exists but renameat2(fromPath, toPath, EXCHANGE) said it doesn\'t; concurrent modification?"
                 ,(StringPtr *)&this_local,(StringPtr *)&fromPath_local.content.size_);
      kj::_::Debug::Fault::~Fault(&f_2);
      return false;
    }
    if ((local_80 != 0x16) && (local_80 != 0x26)) {
      if (errorReason == (int *)0x0) {
        kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                  (&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x467,local_80,"renameat2(fromPath, toPath, EXCHANGE)","fromPath, toPath",
                   (StringPtr *)&this_local,(StringPtr *)&fromPath_local.content.size_);
        kj::_::Debug::Fault::~Fault(&local_b8);
        return false;
      }
      *errorReason = local_80;
      return false;
    }
  }
  else {
    bVar3 = has<kj::WriteMode,void>(mode,CREATE);
    if (bVar3) {
      _auStack_f0 = &local_3c;
      local_e8 = (StringPtr *)&this_local;
      local_d8 = &fromPath_local.content.size_;
      local_e0 = this;
      local_cc = kj::_::Debug::
                 syscallError<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::_lambda()_3_>
                           ((anon_class_32_4_43b4ee3f *)auStack_f0,false);
      if (local_cc == 0) {
        return true;
      }
      if (local_cc == 0x11) {
        return false;
      }
      if ((local_cc != 0x16) && (local_cc != 0x26)) {
        if (errorReason == (int *)0x0) {
          kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                    ((Fault *)(stats.__glibc_reserved + 2),
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x47f,local_cc,"renameat2(fromPath, toPath, NOREPLACE)","fromPath, toPath",
                     (StringPtr *)&this_local,(StringPtr *)&fromPath_local.content.size_);
          kj::_::Debug::Fault::~Fault((Fault *)(stats.__glibc_reserved + 2));
          return false;
        }
        *errorReason = local_cc;
        return false;
      }
    }
  }
  bVar3 = has<kj::WriteMode,void>(mode,CREATE);
  if ((bVar3) && (bVar3 = has<kj::WriteMode,void>(mode,MODIFY), bVar3)) {
    f_4.exception = (Exception *)this;
    local_194 = kj::_::Debug::
                syscall<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::_lambda()_4_>
                          ((anon_class_24_3_5d5706a4 *)&f_4,false);
    pvVar6 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_194);
    if (pvVar6 != (void *)0x0) {
      away.content.disposer = (ArrayDisposer *)fromPath_local.content.size_;
      path.content.size_ = toPath.content.size_;
      path.content.ptr = (char *)fromPath_local.content.size_;
      Path::parse((Path *)local_1d0,path);
      PathPtr::PathPtr((PathPtr *)&local_210,(Path *)local_1d0);
      _auStack_230 = (stat *)local_190;
      Function<int(kj::StringPtr)>::
      Function<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::_lambda(kj::StringPtr)_1_>
                ((Function<int(kj::StringPtr)> *)&local_220,(Type *)auStack_230);
      createNamedTemporary((String *)local_200,this,(PathPtr)local_210,CREATE,&local_220);
      Function<int_(kj::StringPtr)>::~Function(&local_220);
      f_5.exception = (Exception *)this;
      local_234 = kj::_::Debug::
                  syscall<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::_lambda()_5_>
                            ((anon_class_24_3_0b40f133 *)&f_5,false);
      pvVar6 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_234);
      if (pvVar6 == (void *)0x0) {
        iVar4 = kj::_::Debug::SyscallResult::getErrorNumber(&local_234);
        kj::_::Debug::Fault::Fault
                  ((Fault *)&_kjSyscallError_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x4ae,iVar4,"renameat(fd, toPath.cStr(), fd, away.cStr())","");
        iVar4 = OwnFd::operator_cast_to_int(&this->fd);
        pcVar7 = String::cStr((String *)local_200);
        unlinkat(iVar4,pcVar7,(uint)(((uint)stats.st_nlink & 0xf000) == 0x4000) << 9);
        toPath_local.content.size_._7_1_ = false;
        local_25c = 1;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjSyscallError_3);
      }
      else {
        __kjSyscallError_4 = &local_3c;
        pSVar8 = (StringPtr *)&this_local;
        local_268 = &fromPath_local.content.size_;
        local_278 = pSVar8;
        local_270 = this;
        local_260 = kj::_::Debug::
                    syscallError<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::_lambda()_6_>
                              ((anon_class_32_4_43b4ee3f *)&_kjSyscallError_4,false);
        if (local_260 == 0) {
          uVar5 = OwnFd::operator_cast_to_int(&this->fd);
          StringPtr::StringPtr((StringPtr *)(stats_1.__glibc_reserved + 2),(String *)local_200);
          path_01.content.size_ = (size_t)pSVar8;
          path_01.content.ptr = local_2b8;
          rmrf((anon_unknown_9 *)(ulong)uVar5,(int)stats_1.__glibc_reserved[2],path_01);
          toPath_local.content.size_._7_1_ = true;
          local_25c = 1;
        }
        else {
          local_298 = (String *)local_200;
          local_290 = &fromPath_local.content.size_;
          _auStack_2a0 = this;
          local_284 = local_260;
          local_288 = kj::_::Debug::
                      syscallError<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::_lambda()_7_>
                                ((anon_class_24_3_bd7859d7 *)auStack_2a0,false);
          if (local_288 != 0) {
            f_6.exception._4_4_ = local_288;
          }
          if (errorReason == (int *)0x0) {
            kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                      (&local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                       ,0x4be,local_284,"rename(fromPath, toPath)","fromPath, toPath",
                       (StringPtr *)&this_local,(StringPtr *)&fromPath_local.content.size_);
            toPath_local.content.size_._7_1_ = false;
            local_25c = 1;
            kj::_::Debug::Fault::~Fault(&local_2b0);
          }
          else {
            *errorReason = local_284;
            toPath_local.content.size_._7_1_ = false;
            local_25c = 1;
          }
        }
      }
      String::~String((String *)local_200);
      Path::~Path((Path *)local_1d0);
      return toPath_local.content.size_._7_1_;
    }
    iVar4 = kj::_::Debug::SyscallResult::getErrorNumber(&local_194);
    kj::_::Debug::Fault::Fault
              ((Fault *)&toPathParsed.parts.disposer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x494,iVar4,"fstatat(fd, toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)","");
    kj::_::Debug::Fault::~Fault((Fault *)&toPathParsed.parts.disposer);
    return false;
  }
  bVar3 = has<kj::WriteMode,void>(mode,CREATE);
  if (bVar3) {
    local_368 = &fromPath_local.content.size_;
    local_360 = (stat *)local_350;
    _auStack_370 = this;
    local_354 = kj::_::Debug::
                syscallError<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::_lambda()_8_>
                          ((anon_class_24_3_5d5706a4 *)auStack_370,false);
    if (local_354 == 0) {
      return false;
    }
    if ((local_354 != 2) && (local_354 != 0x14)) {
      kj::_::Debug::Fault::Fault<int,kj::StringPtr&>
                ((Fault *)(stats_2.__glibc_reserved + 2),
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x4d4,local_354,"fstatat(fd, toPath)","toPath",
                 (StringPtr *)&fromPath_local.content.size_);
      local_25c = 1;
      kj::_::Debug::Fault::~Fault((Fault *)(stats_2.__glibc_reserved + 2));
      return false;
    }
  }
  else {
    bVar3 = has<kj::WriteMode,void>(mode,MODIFY);
    if (!bVar3) {
      return false;
    }
    local_428 = &fromPath_local.content.size_;
    local_420 = (stat *)local_410;
    _auStack_430 = this;
    f_8.exception._4_4_ =
         kj::_::Debug::
         syscallError<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::_lambda()_9_>
                   ((anon_class_24_3_5d5706a4 *)auStack_430,false);
    if (f_8.exception._4_4_ != 0) {
      if ((f_8.exception._4_4_ != 2) && (f_8.exception._4_4_ != 0x14)) {
        local_414 = f_8.exception._4_4_;
        kj::_::Debug::Fault::Fault<int,kj::StringPtr&>
                  (&local_440,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x4df,f_8.exception._4_4_,"fstatat(fd, toPath)","toPath",
                   (StringPtr *)&fromPath_local.content.size_);
        local_25c = 1;
        kj::_::Debug::Fault::~Fault(&local_440);
        return false;
      }
      return false;
    }
    local_414 = 0;
  }
  sVar2 = fromPath_local.content.size_;
  pcVar7 = fromPath_local.content.ptr;
  pDVar1 = this_local;
  uVar5 = local_3c;
  mode_00 = operator|(CREATE,MODIFY);
  toPath_00.content.size_ = toPath.content.size_;
  toPath_00.content.ptr = (char *)sVar2;
  fromPath_00.content.size_ = (size_t)pcVar7;
  fromPath_00.content.ptr = (char *)pDVar1;
  bVar3 = tryCommitReplacement(this,toPath_00,uVar5,fromPath_00,mode_00,errorReason);
  return bVar3;
}

Assistant:

bool tryCommitReplacement(StringPtr toPath, int fromDirFd, StringPtr fromPath, WriteMode mode,
                            int* errorReason = nullptr) const {
    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // Always clobber. Try it.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr())) {
        case EISDIR:
        case ENOTDIR:
        case ENOTEMPTY:
        case EEXIST:
          // Failed because target exists and due to the various weird quirks of rename(), it
          // can't remove it for us. On Linux we can try an exchange instead. On others we have
          // to move the target out of the way.
          break;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) { return false; }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }

#if __linux__ && defined(RENAME_EXCHANGE) && defined(SYS_renameat2)
    // Try to use Linux's renameat2() to atomically check preconditions and apply.

    if (has(mode, WriteMode::MODIFY)) {
      // Use an exchange to implement modification.
      //
      // We reach this branch when performing a MODIFY-only, or when performing a CREATE | MODIFY
      // in which we determined above that there's a node of a different type blocking the
      // exchange.

      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_EXCHANGE)) {
        case ENOSYS:  // Syscall not supported by kernel.
        case EINVAL:  // Maybe we screwed up, or maybe the syscall is not supported by the
                      // filesystem. Unfortunately, there's no way to tell, so assume the latter.
                      // ZFS in particular apparently produces EINVAL.
          break;  // fall back to traditional means
        case ENOENT:
          // Presumably because the target path doesn't exist.
          if (has(mode, WriteMode::CREATE)) {
            KJ_FAIL_ASSERT("rename(tmp, path) claimed path exists but "
                "renameat2(fromPath, toPath, EXCHANGE) said it doesn't; concurrent modification?",
                fromPath, toPath) { return false; }
          } else {
            // Assume target doesn't exist.
            return false;
          }
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, EXCHANGE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        // Successful swap! Delete swapped-out content.
        rmrf(fromDirFd, fromPath);
        return true;
      }
    } else if (has(mode, WriteMode::CREATE)) {
      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_NOREPLACE)) {
        case ENOSYS:  // Syscall not supported by kernel.
        case EINVAL:  // Maybe we screwed up, or maybe the syscall is not supported by the
                      // filesystem. Unfortunately, there's no way to tell, so assume the latter.
                      // ZFS in particular apparently produces EINVAL.
          break;  // fall back to traditional means
        case EEXIST:
          return false;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, NOREPLACE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }
#endif

    // We're unable to do what we wanted atomically. :(

    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // We failed to atomically delete the target previously. So now we need to do two calls in
      // rapid succession to move the old file away then move the new one into place.

      // Find out what kind of file exists at the target path.
      struct stat stats;
      KJ_SYSCALL(fstatat(fd, toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) { return false; }

      // Create a temporary location to move the existing object to. Note that rename() allows a
      // non-directory to replace a non-directory, and allows a directory to replace an empty
      // directory. So we have to create the right type.
      Path toPathParsed = Path::parse(toPath);
      String away = createNamedTemporary(toPathParsed, WriteMode::CREATE,
          [&](StringPtr candidatePath) {
        if (S_ISDIR(stats.st_mode)) {
          return mkdirat(fd, candidatePath.cStr(), 0700);
        } else {
#if __APPLE__ || __FreeBSD__
          // - No mknodat() on OSX, gotta open() a file, ugh.
          // - On a modern FreeBSD, mknodat() is reserved strictly for device nodes,
          //   you cannot create a regular file using it (EINVAL).
          int newFd = openat(fd, candidatePath.cStr(),
                             O_RDWR | O_CREAT | O_EXCL | MAYBE_O_CLOEXEC, 0700);
          if (newFd >= 0) close(newFd);
          return newFd;
#else
          return mknodat(fd, candidatePath.cStr(), S_IFREG | 0600, dev_t());
#endif
        }
      });

      // OK, now move the target object to replace the thing we just created.
      KJ_SYSCALL(renameat(fd, toPath.cStr(), fd, away.cStr())) {
        // Something went wrong. Remove the thing we just created.
        unlinkat(fd, away.cStr(), S_ISDIR(stats.st_mode) ? AT_REMOVEDIR : 0);
        return false;
      }

      // Now move the source object to the target location.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd, toPath.cStr())) {
        default:
          // Try to put things back where they were. If this fails, though, then we have little
          // choice but to leave things broken.
          KJ_SYSCALL_HANDLE_ERRORS(renameat(fd, away.cStr(), fd, toPath.cStr())) {
            default: break;
          }

          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      }

      // OK, success. Delete the old content.
      rmrf(fd, away);
      return true;
    } else {
      // Only one of CREATE or MODIFY is specified, so we need to verify non-atomically that the
      // corresponding precondition (must-not-exist or must-exist, respectively) is held.
      if (has(mode, WriteMode::CREATE)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            break;  // doesn't exist; continue
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          return false;  // already exists; fail
        }
      } else if (has(mode, WriteMode::MODIFY)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            return false;  // doesn't exist; fail
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          // already exists; continue
        }
      } else {
        // Neither CREATE nor MODIFY.
        return false;
      }

      // Start over in create-and-modify mode.
      return tryCommitReplacement(toPath, fromDirFd, fromPath,
                                  WriteMode::CREATE | WriteMode::MODIFY,
                                  errorReason);
    }
  }